

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_scan_avx2_256_32.c
# Opt level: O3

parasail_result_t *
parasail_sw_stats_table_scan_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long lVar1;
  __m256i alVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  long lVar22;
  long lVar23;
  long lVar24;
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  __m256i c_03;
  __m256i c_04;
  __m256i c_05;
  int iVar25;
  int iVar26;
  uint uVar27;
  parasail_result_t *ppVar28;
  __m256i *b;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *b_02;
  __m256i *b_03;
  __m256i *palVar29;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *__dest;
  __m256i *__dest_00;
  __m256i *__dest_01;
  __m256i *__dest_02;
  __m256i *ptr;
  __m256i *palVar30;
  size_t __n;
  ulong uVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  uint uVar35;
  int iVar36;
  uint uVar37;
  long lVar38;
  ulong uVar39;
  int iVar40;
  long lVar41;
  long lVar42;
  int iVar43;
  long lVar44;
  ulong uVar45;
  uint uVar46;
  ulong uVar47;
  long lVar48;
  undefined1 auVar49 [16];
  undefined1 auVar52 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar59 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined4 in_stack_fffffffffffffc58;
  undefined4 uVar66;
  undefined4 uVar67;
  int local_354;
  long local_2f8;
  undefined1 local_2e8 [32];
  undefined1 local_2c8 [32];
  undefined1 local_218 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_78 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_stats_table_scan_profile_avx2_256_32_cold_8();
  }
  else {
    pvVar3 = (profile->profile32).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sw_stats_table_scan_profile_avx2_256_32_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_table_scan_profile_avx2_256_32_cold_6();
      }
      else {
        uVar46 = profile->s1Len;
        uVar39 = (ulong)uVar46;
        if ((int)uVar46 < 1) {
          parasail_sw_stats_table_scan_profile_avx2_256_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_stats_table_scan_profile_avx2_256_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_stats_table_scan_profile_avx2_256_32_cold_3();
        }
        else if (open < 0) {
          parasail_sw_stats_table_scan_profile_avx2_256_32_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_stats_table_scan_profile_avx2_256_32_cold_1();
        }
        else {
          uVar45 = uVar39 + 7;
          pvVar5 = (profile->profile32).matches;
          pvVar6 = (profile->profile32).similar;
          iVar25 = ppVar4->min;
          uVar27 = 0x80000000 - iVar25;
          if (iVar25 != -open && SBORROW4(iVar25,-open) == iVar25 + open < 0) {
            uVar27 = open | 0x80000000;
          }
          iVar25 = 0x7ffffffe - ppVar4->max;
          ppVar28 = parasail_result_new_table3((uint)uVar45 & 0x7ffffff8,s2Len);
          if (ppVar28 != (parasail_result_t *)0x0) {
            uVar47 = uVar45 >> 3;
            ppVar28->flag = ppVar28->flag | 0x8430404;
            b = parasail_memalign___m256i(0x20,uVar47);
            b_00 = parasail_memalign___m256i(0x20,uVar47);
            b_01 = parasail_memalign___m256i(0x20,uVar47);
            b_02 = parasail_memalign___m256i(0x20,uVar47);
            b_03 = parasail_memalign___m256i(0x20,uVar47);
            palVar29 = parasail_memalign___m256i(0x20,uVar47);
            b_04 = parasail_memalign___m256i(0x20,uVar47);
            b_05 = parasail_memalign___m256i(0x20,uVar47);
            __dest = parasail_memalign___m256i(0x20,uVar47);
            __dest_00 = parasail_memalign___m256i(0x20,uVar47);
            __dest_01 = parasail_memalign___m256i(0x20,uVar47);
            __dest_02 = parasail_memalign___m256i(0x20,uVar47);
            ptr = parasail_memalign___m256i(0x20,uVar47);
            palVar30 = parasail_memalign___m256i(0x20,uVar47);
            auVar54._8_8_ = 0;
            auVar54._0_8_ = b;
            auVar59._8_8_ = 0;
            auVar59._0_8_ = b_00;
            auVar54 = vpunpcklqdq_avx(auVar54,auVar59);
            auVar49._8_8_ = 0;
            auVar49._0_8_ = b_01;
            auVar52._8_8_ = 0;
            auVar52._0_8_ = b_02;
            auVar59 = vpunpcklqdq_avx(auVar49,auVar52);
            auVar49 = ZEXT116(0) * auVar59 + ZEXT116(1) * auVar54;
            auVar52 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar59;
            auVar53._8_8_ = 0;
            auVar53._0_8_ = b_03;
            auVar60._8_8_ = 0;
            auVar60._0_8_ = palVar29;
            auVar54 = vpunpcklqdq_avx(auVar53,auVar60);
            auVar61._8_8_ = 0;
            auVar61._0_8_ = b_04;
            auVar63._8_8_ = 0;
            auVar63._0_8_ = b_05;
            auVar59 = vpunpcklqdq_avx(auVar61,auVar63);
            auVar54 = ZEXT116(0) * auVar59 + ZEXT116(1) * auVar54;
            auVar59 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar59;
            auVar62 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar50._0_8_ = -(ulong)(auVar49._0_8_ == 0);
            auVar50._8_8_ = -(ulong)(auVar49._8_8_ == 0);
            auVar50._16_8_ = -(ulong)(auVar52._0_8_ == 0);
            auVar50._24_8_ = -(ulong)(auVar52._8_8_ == 0);
            auVar55._0_8_ = -(ulong)(auVar54._0_8_ == 0);
            auVar55._8_8_ = -(ulong)(auVar54._8_8_ == 0);
            auVar55._16_8_ = -(ulong)(auVar59._0_8_ == 0);
            auVar55._24_8_ = -(ulong)(auVar59._8_8_ == 0);
            auVar50 = vpackssdw_avx2(auVar50,auVar55);
            if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar50 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar50 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar50 >> 0x7f,0) != '\0') ||
                  (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar50 >> 0xbf,0) != '\0') ||
                (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar50[0x1f] < '\0') {
              return (parasail_result_t *)0x0;
            }
            if (__dest == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest_00 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest_01 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest_02 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (palVar30 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            iVar26 = uVar27 + 1;
            uVar37 = (uint)uVar47;
            local_2c8._4_4_ = uVar37;
            local_2c8._0_4_ = uVar37;
            local_2c8._8_4_ = uVar37;
            local_2c8._12_4_ = uVar37;
            local_2c8._16_4_ = uVar37;
            local_2c8._20_4_ = uVar37;
            local_2c8._24_4_ = uVar37;
            local_2c8._28_4_ = uVar37;
            auVar21 = vperm2i128_avx2(local_2c8,local_2c8,0x28);
            iVar43 = -(gap * uVar37);
            auVar51._4_4_ = iVar43;
            auVar51._0_4_ = iVar43;
            auVar51._8_4_ = iVar43;
            auVar51._12_4_ = iVar43;
            auVar51._16_4_ = iVar43;
            auVar51._20_4_ = iVar43;
            auVar51._24_4_ = iVar43;
            auVar51._28_4_ = iVar43;
            auVar50 = vpblendd_avx2(auVar51,ZEXT1632((undefined1  [16])0x0),1);
            auVar51 = ZEXT1632(CONCAT124(SUB6412(ZEXT1664((undefined1  [16])0x0),4),iVar26));
            auVar50 = vpaddd_avx2(auVar51,auVar50);
            uVar66 = SUB84(palVar30,0);
            uVar67 = (undefined4)((ulong)palVar30 >> 0x20);
            alVar2[0]._4_4_ = iVar26;
            alVar2[0]._0_4_ = in_stack_fffffffffffffc58;
            alVar2[1] = (longlong)b_01;
            alVar2[2] = (longlong)palVar29;
            alVar2[3]._0_4_ = uVar66;
            alVar2[3]._4_4_ = uVar67;
            iVar43 = iVar26;
            palVar30 = palVar29;
            parasail_memset___m256i(b_03,alVar2,uVar47);
            c[0]._4_4_ = iVar43;
            c[0]._0_4_ = in_stack_fffffffffffffc58;
            c[1] = (longlong)b_01;
            c[2] = (longlong)palVar30;
            c[3]._0_4_ = uVar66;
            c[3]._4_4_ = uVar67;
            parasail_memset___m256i(palVar29,c,uVar47);
            c_00[0]._4_4_ = iVar43;
            c_00[0]._0_4_ = in_stack_fffffffffffffc58;
            c_00[1] = (longlong)b_01;
            c_00[2] = (longlong)palVar30;
            c_00[3]._0_4_ = uVar66;
            c_00[3]._4_4_ = uVar67;
            parasail_memset___m256i(b_04,c_00,uVar47);
            c_01[0]._4_4_ = iVar43;
            c_01[0]._0_4_ = in_stack_fffffffffffffc58;
            c_01[1] = (longlong)b_01;
            c_01[2] = (longlong)palVar30;
            c_01[3]._0_4_ = uVar66;
            c_01[3]._4_4_ = uVar67;
            parasail_memset___m256i(b_05,c_01,uVar47);
            c_02[0]._4_4_ = iVar43;
            c_02[0]._0_4_ = in_stack_fffffffffffffc58;
            c_02[1] = (longlong)b_01;
            c_02[2] = (longlong)palVar30;
            c_02[3]._0_4_ = uVar66;
            c_02[3]._4_4_ = uVar67;
            parasail_memset___m256i(b,c_02,uVar47);
            c_03[0]._4_4_ = iVar43;
            c_03[0]._0_4_ = in_stack_fffffffffffffc58;
            c_03[1] = (longlong)b_01;
            c_03[2] = (longlong)palVar30;
            c_03[3]._0_4_ = uVar66;
            c_03[3]._4_4_ = uVar67;
            parasail_memset___m256i(b_00,c_03,uVar47);
            c_04[0]._4_4_ = iVar43;
            c_04[0]._0_4_ = in_stack_fffffffffffffc58;
            c_04[1] = (longlong)b_01;
            c_04[2] = (longlong)palVar30;
            c_04[3]._0_4_ = uVar66;
            c_04[3]._4_4_ = uVar67;
            parasail_memset___m256i(b_01,c_04,uVar47);
            c_05[0]._4_4_ = iVar43;
            c_05[0]._0_4_ = in_stack_fffffffffffffc58;
            c_05[1] = (longlong)b_01;
            c_05[2] = (longlong)palVar30;
            c_05[3]._0_4_ = uVar66;
            c_05[3]._4_4_ = uVar67;
            parasail_memset___m256i(b_02,c_05,uVar47);
            auVar57._4_4_ = gap;
            auVar57._0_4_ = gap;
            auVar57._8_4_ = gap;
            auVar57._12_4_ = gap;
            auVar57._16_4_ = gap;
            auVar57._20_4_ = gap;
            auVar57._24_4_ = gap;
            auVar57._28_4_ = gap;
            auVar18._4_4_ = open;
            auVar18._0_4_ = open;
            auVar18._8_4_ = open;
            auVar18._12_4_ = open;
            auVar18._16_4_ = open;
            auVar18._20_4_ = open;
            auVar18._24_4_ = open;
            auVar18._28_4_ = open;
            uVar27 = uVar37 - 1;
            auVar18 = vpsubd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar18);
            lVar33 = (ulong)uVar27 << 5;
            auVar56._8_4_ = 1;
            auVar56._0_8_ = 0x100000001;
            auVar56._12_4_ = 1;
            auVar56._16_4_ = 1;
            auVar56._20_4_ = 1;
            auVar56._24_4_ = 1;
            auVar56._28_4_ = 1;
            auVar55 = vpcmpeqd_avx2(auVar62,auVar62);
            uVar31 = uVar47;
            do {
              *(undefined1 (*) [32])((long)*ptr + lVar33) = auVar18;
              *(undefined1 (*) [32])(CONCAT44(uVar67,uVar66) + lVar33) = auVar56;
              auVar18 = vpsubd_avx2(auVar18,auVar57);
              auVar56 = vpsubd_avx2(auVar56,auVar55);
              lVar33 = lVar33 + -0x20;
              iVar32 = (int)uVar31;
              uVar35 = iVar32 - 1;
              uVar31 = (ulong)uVar35;
            } while (uVar35 != 0 && 0 < iVar32);
            palVar29 = palVar30 + uVar27;
            __n = uVar47 << 5;
            auVar55 = vpalignr_avx2(local_2c8,auVar21,0xc);
            uVar31 = (ulong)(uint)s2Len;
            lVar41 = (ulong)(uVar37 + (uVar37 == 0)) << 5;
            lVar38 = uVar47 * uVar31;
            lVar33 = lVar38 * 4;
            lVar1 = lVar38 * 8;
            lVar22 = lVar38 * 0xc;
            lVar24 = lVar38 * 0x1c;
            lVar48 = lVar38 * 0x10;
            lVar23 = lVar38 * 0x14;
            lVar38 = lVar38 * 0x18;
            local_118._4_4_ = iVar26;
            local_118._0_4_ = iVar26;
            local_118._8_4_ = iVar26;
            local_118._12_4_ = iVar26;
            local_118._16_4_ = iVar26;
            local_118._20_4_ = iVar26;
            local_118._24_4_ = iVar26;
            local_118._28_4_ = iVar26;
            auVar21._4_4_ = iVar25;
            auVar21._0_4_ = iVar25;
            auVar21._8_4_ = iVar25;
            auVar21._12_4_ = iVar25;
            auVar21._16_4_ = iVar25;
            auVar21._20_4_ = iVar25;
            auVar21._24_4_ = iVar25;
            auVar21._28_4_ = iVar25;
            local_2f8 = 0;
            uVar47 = 0;
            local_354 = 0;
            auVar18 = local_118;
            auVar62 = local_118;
            do {
              lVar34 = (long)(int)(ppVar4->mapper[(byte)s2[uVar47]] * uVar37) * 0x20;
              alVar2 = b_05[uVar27];
              auVar56 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28);
              auVar58 = vpalignr_avx2((undefined1  [32])alVar2,auVar56,0xc);
              alVar2 = b_04[uVar27];
              auVar56 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28);
              auVar13 = vpalignr_avx2((undefined1  [32])alVar2,auVar56,0xc);
              alVar2 = *palVar29;
              auVar56 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28);
              auVar57 = vpalignr_avx2((undefined1  [32])alVar2,auVar56,0xc);
              alVar2 = b_03[uVar27];
              auVar56 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28);
              auVar56 = vpalignr_avx2((undefined1  [32])alVar2,auVar56,0xc);
              lVar44 = 0;
              local_2e8 = ZEXT1632(ZEXT816(0));
              local_218 = ZEXT1632(ZEXT816(0));
              auVar64 = ZEXT1664((undefined1  [16])0x0);
              auVar17._4_4_ = iVar26;
              auVar17._0_4_ = iVar26;
              auVar17._8_4_ = iVar26;
              auVar17._12_4_ = iVar26;
              auVar17._16_4_ = iVar26;
              auVar17._20_4_ = iVar26;
              auVar17._24_4_ = iVar26;
              auVar17._28_4_ = iVar26;
              auVar65 = ZEXT1664((undefined1  [16])0x0);
              do {
                auVar8 = vpaddd_avx2(auVar56,*(undefined1 (*) [32])((long)pvVar3 + lVar44 + lVar34))
                ;
                auVar9 = vpaddd_avx2(auVar57,*(undefined1 (*) [32])((long)pvVar5 + lVar44 + lVar34))
                ;
                auVar56 = *(undefined1 (*) [32])((long)*b_03 + lVar44);
                auVar57 = *(undefined1 (*) [32])((long)*palVar30 + lVar44);
                auVar10 = vpaddd_avx2(auVar13,*(undefined1 (*) [32])((long)pvVar6 + lVar44 + lVar34)
                                     );
                auVar13 = *(undefined1 (*) [32])((long)*b_04 + lVar44);
                auVar11 = vpaddd_avx2(auVar65._0_32_,*(undefined1 (*) [32])((long)*ptr + lVar44));
                auVar19 = vpsubd_avx2(auVar58,_DAT_00909280);
                auVar58 = *(undefined1 (*) [32])((long)*b_05 + lVar44);
                auVar14 = vpcmpgtd_avx2(auVar11,auVar17);
                auVar7 = vblendvps_avx(auVar64._0_32_,local_78,auVar14);
                auVar64 = ZEXT3264(auVar7);
                local_218 = vblendvps_avx(local_218,local_2c8,auVar14);
                auVar12 = vpaddd_avx2(local_f8,*(undefined1 (*) [32])
                                                (CONCAT44(uVar67,uVar66) + lVar44));
                local_2e8 = vblendvps_avx(local_2e8,auVar12,auVar14);
                auVar12._4_4_ = open;
                auVar12._0_4_ = open;
                auVar12._8_4_ = open;
                auVar12._12_4_ = open;
                auVar12._16_4_ = open;
                auVar12._20_4_ = open;
                auVar12._24_4_ = open;
                auVar12._28_4_ = open;
                auVar12 = vpsubd_avx2(auVar56,auVar12);
                auVar14._4_4_ = gap;
                auVar14._0_4_ = gap;
                auVar14._8_4_ = gap;
                auVar14._12_4_ = gap;
                auVar14._16_4_ = gap;
                auVar14._20_4_ = gap;
                auVar14._24_4_ = gap;
                auVar14._28_4_ = gap;
                auVar14 = vpsubd_avx2(*(undefined1 (*) [32])((long)*b + lVar44),auVar14);
                auVar15 = vpcmpgtd_avx2(auVar12,auVar14);
                auVar16 = vpmaxsd_avx2(auVar12,auVar14);
                auVar12 = vblendvps_avx(*(undefined1 (*) [32])((long)*b_00 + lVar44),auVar57,auVar15
                                       );
                auVar14 = vblendvps_avx(*(undefined1 (*) [32])((long)*b_01 + lVar44),auVar13,auVar15
                                       );
                auVar15 = vblendvps_avx(*(undefined1 (*) [32])((long)*b_02 + lVar44),auVar58,auVar15
                                       );
                auVar20 = vpsubd_avx2(auVar15,_DAT_00909280);
                auVar15 = vpcmpgtd_avx2(auVar16,auVar8);
                *(undefined1 (*) [32])((long)*b + lVar44) = auVar16;
                *(undefined1 (*) [32])((long)*b_00 + lVar44) = auVar12;
                local_78 = vblendvps_avx(auVar9,auVar12,auVar15);
                *(undefined1 (*) [32])((long)*b_01 + lVar44) = auVar14;
                local_2c8 = vblendvps_avx(auVar10,auVar14,auVar15);
                local_f8 = vblendvps_avx(auVar19,auVar20,auVar15);
                *(undefined1 (*) [32])((long)*b_02 + lVar44) = auVar20;
                auVar17 = vpmaxsd_avx2(auVar17,auVar11);
                auVar12 = vpmaxsd_avx2(auVar16,auVar8);
                auVar65 = ZEXT3264(auVar12);
                *(undefined1 (*) [32])((long)*b_03 + lVar44) = auVar8;
                *(undefined1 (*) [32])((long)*palVar30 + lVar44) = auVar9;
                *(undefined1 (*) [32])((long)*b_04 + lVar44) = auVar10;
                *(undefined1 (*) [32])((long)*b_05 + lVar44) = auVar19;
                lVar44 = lVar44 + 0x20;
              } while (lVar41 != lVar44);
              auVar56 = vperm2f128_avx(local_78,local_78,0x28);
              local_78 = vpalignr_avx2(local_78,auVar56,0xc);
              auVar56 = vperm2i128_avx2(local_2c8,local_2c8,0x28);
              local_2c8 = vpalignr_avx2(local_2c8,auVar56,0xc);
              auVar56 = vperm2i128_avx2(local_f8,local_f8,0x28);
              auVar57 = vperm2i128_avx2(auVar12,auVar12,0x28);
              auVar12 = vpalignr_avx2(auVar12,auVar57,0xc);
              auVar57 = vpaddd_avx2(auVar12,(undefined1  [32])*ptr);
              local_f8 = vpalignr_avx2(local_f8,auVar56,0xc);
              auVar14 = vpcmpgtd_avx2(auVar17,auVar57);
              auVar56 = vblendvps_avx(local_78,auVar7,auVar14);
              auVar13 = vblendvps_avx(local_2c8,local_218,auVar14);
              auVar58 = vpaddd_avx2(local_f8,*(undefined1 (*) [32])CONCAT44(uVar67,uVar66));
              auVar17 = vpmaxsd_avx2(auVar17,auVar57);
              auVar57 = vblendvps_avx(auVar58,local_2e8,auVar14);
              iVar32 = 6;
              do {
                auVar58 = vperm2f128_avx(auVar57,auVar57,0x28);
                auVar7 = vperm2f128_avx(auVar13,auVar13,0x28);
                auVar14 = vperm2f128_avx(auVar56,auVar56,0x28);
                auVar15 = vperm2f128_avx(auVar17,auVar17,0x28);
                auVar15 = vpalignr_avx2(auVar17,auVar15,0xc);
                auVar15 = vpaddd_avx2(auVar50,auVar15);
                auVar8 = vpcmpgtd_avx2(auVar17,auVar15);
                auVar17 = vpmaxsd_avx2(auVar17,auVar15);
                auVar14 = vpalignr_avx2(auVar56,auVar14,0xc);
                auVar56 = vblendvps_avx(auVar14,auVar56,auVar8);
                auVar7 = vpalignr_avx2(auVar13,auVar7,0xc);
                auVar13 = vblendvps_avx(auVar7,auVar13,auVar8);
                auVar58 = vpalignr_avx2(auVar57,auVar58,0xc);
                auVar58 = vpaddd_avx2(auVar55,auVar58);
                auVar57 = vblendvps_avx(auVar58,auVar57,auVar8);
                iVar32 = iVar32 + -1;
              } while (iVar32 != 0);
              auVar58 = vperm2f128_avx(auVar57,auVar57,0x28);
              auVar14 = vpalignr_avx2(auVar57,auVar58,0xc);
              auVar57 = vperm2f128_avx(auVar13,auVar13,0x28);
              auVar7 = vpalignr_avx2(auVar13,auVar57,0xc);
              auVar57 = vperm2i128_avx2(auVar56,auVar56,0x28);
              auVar58 = vpalignr_avx2(auVar56,auVar57,0xc);
              auVar56 = vperm2i128_avx2(auVar17,auVar17,0x28);
              auVar56 = vpalignr_avx2(auVar17,auVar56,0xc);
              auVar17 = vpaddd_avx2(auVar56,auVar51);
              auVar13 = vpcmpgtd_avx2(auVar17,auVar12);
              auVar56 = vblendvps_avx(local_f8,auVar14,auVar13);
              auVar57 = vblendvps_avx(local_2c8,auVar7,auVar13);
              auVar13 = vblendvps_avx(local_78,auVar58,auVar13);
              auVar12 = vpmaxsd_avx2(auVar17,auVar12);
              lVar44 = 0;
              auVar8._4_4_ = open;
              auVar8._0_4_ = open;
              auVar8._8_4_ = open;
              auVar8._12_4_ = open;
              auVar8._16_4_ = open;
              auVar8._20_4_ = open;
              auVar8._24_4_ = open;
              auVar8._28_4_ = open;
              auVar15._4_4_ = gap;
              auVar15._0_4_ = gap;
              auVar15._8_4_ = gap;
              auVar15._12_4_ = gap;
              auVar15._16_4_ = gap;
              auVar15._20_4_ = gap;
              auVar15._24_4_ = gap;
              auVar15._28_4_ = gap;
              lVar34 = local_2f8;
              do {
                auVar9 = *(undefined1 (*) [32])((long)*b_03 + lVar44);
                auVar12 = vpsubd_avx2(auVar12,auVar8);
                auVar10 = vpsubd_avx2(auVar17,auVar15);
                auVar17 = vpmaxsd_avx2(auVar12,auVar10);
                auVar12 = vpcmpgtd_avx2(auVar12,auVar10);
                auVar58 = vblendvps_avx(auVar58,auVar13,auVar12);
                auVar7 = vblendvps_avx(auVar7,auVar57,auVar12);
                auVar56 = vblendvps_avx(auVar14,auVar56,auVar12);
                auVar57 = vpmaxsd_avx2(auVar9,*(undefined1 (*) [32])((long)*b + lVar44));
                auVar10 = vpmaxsd_avx2(auVar57,auVar17);
                auVar14 = vpsubd_avx2(auVar56,_DAT_00909280);
                auVar12 = vpmaxsd_avx2(auVar10,_DAT_00908c40);
                auVar13 = vpcmpeqd_avx2(auVar12,auVar17);
                auVar56 = vblendvps_avx(*(undefined1 (*) [32])((long)*b_00 + lVar44),auVar58,auVar13
                                       );
                auVar57 = vblendvps_avx(*(undefined1 (*) [32])((long)*b_01 + lVar44),auVar7,auVar13)
                ;
                auVar13 = vblendvps_avx(*(undefined1 (*) [32])((long)*b_02 + lVar44),auVar14,auVar13
                                       );
                auVar9 = vpcmpeqd_avx2(auVar9,auVar12);
                auVar56 = vblendvps_avx(auVar56,*(undefined1 (*) [32])((long)*palVar30 + lVar44),
                                        auVar9);
                auVar57 = vblendvps_avx(auVar57,*(undefined1 (*) [32])((long)*b_04 + lVar44),auVar9)
                ;
                auVar9 = vblendvps_avx(auVar13,*(undefined1 (*) [32])((long)*b_05 + lVar44),auVar9);
                auVar13._8_4_ = 1;
                auVar13._0_8_ = 0x100000001;
                auVar13._12_4_ = 1;
                auVar13._16_4_ = 1;
                auVar13._20_4_ = 1;
                auVar13._24_4_ = 1;
                auVar13._28_4_ = 1;
                auVar10 = vpcmpgtd_avx2(auVar13,auVar10);
                auVar13 = vpandn_avx2(auVar10,auVar56);
                *(undefined1 (*) [32])((long)*b_03 + lVar44) = auVar12;
                auVar57 = vpandn_avx2(auVar10,auVar57);
                *(undefined1 (*) [32])((long)*palVar30 + lVar44) = auVar13;
                *(undefined1 (*) [32])((long)*b_04 + lVar44) = auVar57;
                auVar56 = vpandn_avx2(auVar10,auVar9);
                *(undefined1 (*) [32])((long)*b_05 + lVar44) = auVar56;
                lVar42 = *((ppVar28->field_4).trace)->trace_del_table;
                *(int *)(lVar42 + lVar34) = auVar12._0_4_;
                lVar42 = lVar42 + lVar34;
                *(int *)(lVar33 + lVar42) = auVar12._4_4_;
                *(int *)(lVar1 + lVar42) = auVar12._8_4_;
                *(int *)(lVar22 + lVar42) = auVar12._12_4_;
                *(int *)(lVar48 + lVar42) = auVar12._16_4_;
                *(int *)(lVar23 + lVar42) = auVar12._20_4_;
                *(int *)(lVar38 + lVar42) = auVar12._24_4_;
                *(int *)(lVar24 + lVar42) = auVar12._28_4_;
                lVar42 = *(long *)((long)((ppVar28->field_4).trace)->trace_del_table + 8);
                *(int *)(lVar42 + lVar34) = auVar13._0_4_;
                lVar42 = lVar42 + lVar34;
                *(int *)(lVar33 + lVar42) = auVar13._4_4_;
                *(int *)(lVar1 + lVar42) = auVar13._8_4_;
                *(int *)(lVar22 + lVar42) = auVar13._12_4_;
                *(int *)(lVar48 + lVar42) = auVar13._16_4_;
                *(int *)(lVar23 + lVar42) = auVar13._20_4_;
                *(int *)(lVar38 + lVar42) = auVar13._24_4_;
                *(int *)(lVar24 + lVar42) = auVar13._28_4_;
                lVar42 = *(long *)((long)((ppVar28->field_4).trace)->trace_del_table + 0x10);
                *(int *)(lVar42 + lVar34) = auVar57._0_4_;
                lVar42 = lVar42 + lVar34;
                *(int *)(lVar33 + lVar42) = auVar57._4_4_;
                *(int *)(lVar1 + lVar42) = auVar57._8_4_;
                *(int *)(lVar22 + lVar42) = auVar57._12_4_;
                *(int *)(lVar48 + lVar42) = auVar57._16_4_;
                *(int *)(lVar23 + lVar42) = auVar57._20_4_;
                *(int *)(lVar38 + lVar42) = auVar57._24_4_;
                *(int *)(lVar24 + lVar42) = auVar57._28_4_;
                lVar42 = *(long *)((long)((ppVar28->field_4).trace)->trace_del_table + 0x18);
                *(int *)(lVar42 + lVar34) = auVar56._0_4_;
                lVar42 = lVar42 + lVar34;
                *(int *)(lVar33 + lVar42) = auVar56._4_4_;
                *(int *)(lVar1 + lVar42) = auVar56._8_4_;
                auVar62 = vpmaxsd_avx2(auVar62,auVar12);
                *(int *)(lVar22 + lVar42) = auVar56._12_4_;
                auVar62 = vpmaxsd_avx2(auVar62,auVar13);
                *(int *)(lVar48 + lVar42) = auVar56._16_4_;
                auVar9 = vpmaxsd_avx2(auVar57,auVar56);
                *(int *)(lVar23 + lVar42) = auVar56._20_4_;
                auVar62 = vpmaxsd_avx2(auVar62,auVar9);
                *(int *)(lVar38 + lVar42) = auVar56._24_4_;
                *(int *)(lVar24 + lVar42) = auVar56._28_4_;
                auVar21 = vpminsd_avx2(auVar21,auVar12);
                auVar18 = vpmaxsd_avx2(auVar12,auVar18);
                lVar44 = lVar44 + 0x20;
                lVar34 = lVar34 + uVar31 * 4;
              } while (lVar41 != lVar44);
              auVar56 = vpcmpgtd_avx2(auVar18,local_118);
              if ((((((((auVar56 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar56 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar56 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar56 >> 0x7f,0) != '\0') ||
                    (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar56 >> 0xbf,0) != '\0') ||
                  (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar56[0x1f] < '\0') {
                auVar56 = vpermq_avx2(auVar18,0x44);
                auVar56 = vpmaxsd_avx2(auVar18,auVar56);
                auVar57 = vpslldq_avx2(auVar56,8);
                auVar56 = vpmaxsd_avx2(auVar56,auVar57);
                auVar57 = vpslldq_avx2(auVar56,4);
                auVar56 = vpmaxsd_avx2(auVar56,auVar57);
                iVar43 = auVar56._28_4_;
                auVar58._8_4_ = 7;
                auVar58._0_8_ = 0x700000007;
                auVar58._12_4_ = 7;
                auVar58._16_4_ = 7;
                auVar58._20_4_ = 7;
                auVar58._24_4_ = 7;
                auVar58._28_4_ = 7;
                local_118 = vpermd_avx2(auVar58,auVar56);
                memcpy(__dest,b_03,__n);
                memcpy(__dest_00,palVar30,__n);
                memcpy(__dest_01,b_04,__n);
                memcpy(__dest_02,b_05,__n);
                local_354 = (int)uVar47;
              }
              uVar47 = uVar47 + 1;
              local_2f8 = local_2f8 + 4;
            } while (uVar47 != uVar31);
            if ((uVar45 & 0x7ffffff8) == 0) {
              iVar32 = 0;
              iVar36 = 0;
              iVar40 = 0;
            }
            else {
              uVar45 = 0;
              iVar40 = 0;
              iVar36 = 0;
              iVar32 = 0;
              do {
                if ((*(int *)((long)*__dest + uVar45 * 4) == iVar43) &&
                   (uVar46 = ((uint)uVar45 & 7) * uVar37 + ((uint)(uVar45 >> 3) & 0x1fffffff),
                   (int)uVar46 < (int)uVar39)) {
                  iVar32 = *(int *)((long)*__dest_00 + uVar45 * 4);
                  iVar36 = *(int *)((long)*__dest_01 + uVar45 * 4);
                  iVar40 = *(int *)((long)*__dest_02 + uVar45 * 4);
                  uVar39 = (ulong)uVar46;
                }
                uVar46 = (uint)uVar39;
                uVar45 = uVar45 + 1;
              } while ((uVar37 & 0xfffffff) << 3 != (int)uVar45);
            }
            auVar7._4_4_ = iVar26;
            auVar7._0_4_ = iVar26;
            auVar7._8_4_ = iVar26;
            auVar7._12_4_ = iVar26;
            auVar7._16_4_ = iVar26;
            auVar7._20_4_ = iVar26;
            auVar7._24_4_ = iVar26;
            auVar7._28_4_ = iVar26;
            auVar50 = vpcmpgtd_avx2(auVar7,auVar21);
            auVar9._4_4_ = iVar25;
            auVar9._0_4_ = iVar25;
            auVar9._8_4_ = iVar25;
            auVar9._12_4_ = iVar25;
            auVar9._16_4_ = iVar25;
            auVar9._20_4_ = iVar25;
            auVar9._24_4_ = iVar25;
            auVar9._28_4_ = iVar25;
            auVar55 = vpcmpgtd_avx2(auVar62,auVar9);
            auVar50 = vpor_avx2(auVar55,auVar50);
            if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar50 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar50 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar50 >> 0x7f,0) != '\0') ||
                  (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar50 >> 0xbf,0) != '\0') ||
                (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar50[0x1f] < '\0') {
              *(byte *)&ppVar28->flag = (byte)ppVar28->flag | 0x40;
              iVar43 = 0;
              iVar32 = 0;
              iVar36 = 0;
              iVar40 = 0;
              local_354 = 0;
              uVar46 = 0;
            }
            ppVar28->score = iVar43;
            ppVar28->end_query = uVar46;
            ppVar28->end_ref = local_354;
            ((ppVar28->field_4).stats)->matches = iVar32;
            ((ppVar28->field_4).stats)->similar = iVar36;
            ((ppVar28->field_4).stats)->length = iVar40;
            parasail_free((void *)CONCAT44(uVar67,uVar66));
            parasail_free(ptr);
            parasail_free(__dest_02);
            parasail_free(__dest_01);
            parasail_free(__dest_00);
            parasail_free(__dest);
            parasail_free(b_05);
            parasail_free(b_04);
            parasail_free(palVar30);
            parasail_free(b_03);
            parasail_free(b_02);
            parasail_free(b_01);
            parasail_free(b_00);
            parasail_free(b);
            return ppVar28;
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxM;
    __m256i vMaxS;
    __m256i vMaxL;
    __m256i vMaxHUnit;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP  = (__m256i*)profile->profile32.score;
    pvPm = (__m256i*)profile->profile32.matches;
    pvPs = (__m256i*)profile->profile32.similar;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vMaxHUnit = vNegLimit;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi32(segLen), 4);
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi32_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi32(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;

    parasail_memset___m256i(pvH, vZero, segLen);
    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_sub_epi32(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_sub_epi32(vGapper, vGapE);
            vGapperL = _mm256_add_epi32(vGapperL, vOne);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i case0;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 4);
        vHpM = _mm256_slli_si256_rpl(vHpM, 4);
        vHpS = _mm256_slli_si256_rpl(vHpS, 4);
        vHpL = _mm256_slli_si256_rpl(vHpL, 4);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_sub_epi32(vH, vGapO);
            vE_ext = _mm256_sub_epi32(vE, vGapE);
            case1 = _mm256_cmpgt_epi32(vE_opn, vE_ext);
            vE = _mm256_max_epi32(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_add_epi32(vEL, vOne);
            vGapper = _mm256_add_epi32(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi32(vF, vGapper),
                    _mm256_cmpeq_epi32(vF, vGapper));
            vF = _mm256_max_epi32(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi32(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_add_epi32(vHp, vW);
            vHpM = _mm256_add_epi32(vHpM, vWM);
            vHpS = _mm256_add_epi32(vHpS, vWS);
            vHpL = _mm256_add_epi32(vHpL, vOne);
            case1 = _mm256_cmpgt_epi32(vE, vHp);
            vHt = _mm256_max_epi32(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 4);
        vHtM = _mm256_slli_si256_rpl(vHtM, 4);
        vHtS = _mm256_slli_si256_rpl(vHtS, 4);
        vHtL = _mm256_slli_si256_rpl(vHtL, 4);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_add_epi32(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi32(vGapper, vF),
                _mm256_cmpeq_epi32(vGapper, vF));
        vF = _mm256_max_epi32(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_add_epi32(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 4);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 4);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 4);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 4);
            vFt = _mm256_add_epi32(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi32(vFt, vF),
                    _mm256_cmpeq_epi32(vFt, vF));
            vF = _mm256_max_epi32(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_add_epi32(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 4);
        vFM = _mm256_slli_si256_rpl(vFM, 4);
        vFS = _mm256_slli_si256_rpl(vFS, 4);
        vFL = _mm256_slli_si256_rpl(vFL, 4);
        vF = _mm256_add_epi32(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi32(vF, vHt);
        vH = _mm256_max_epi32(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_sub_epi32(vH, vGapO);
            vF_ext = _mm256_sub_epi32(vF, vGapE);
            vF = _mm256_max_epi32(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi32(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_add_epi32(vFL, vOne);
            vH = _mm256_max_epi32(vHp, vE);
            vH = _mm256_max_epi32(vH, vF);
            vH = _mm256_max_epi32(vH, vZero);
            case1 = _mm256_cmpeq_epi32(vH, vHp);
            case2 = _mm256_cmpeq_epi32(vH, vF);
            case0 = _mm256_cmpeq_epi32(vH, vZero);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHM = _mm256_blendv_epi8(vHM, vZero, case0);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHS = _mm256_blendv_epi8(vHS, vZero, case0);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            vHL = _mm256_blendv_epi8(vHL, vZero, case0);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
            {
                __m256i cond_max = _mm256_cmpgt_epi32(vH, vMaxH);
                vMaxH = _mm256_max_epi32(vH, vMaxH);
                vMaxM = _mm256_blendv_epi8(vMaxM, vHM, cond_max);
                vMaxS = _mm256_blendv_epi8(vMaxS, vHS, cond_max);
                vMaxL = _mm256_blendv_epi8(vMaxL, vHL, cond_max);
            }
        } 

        {
            __m256i vCompare = _mm256_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi32_rpl(vMaxH);
                vMaxHUnit = _mm256_set1_epi32(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m256i)*segLen);
                (void)memcpy(pvHMMax, pvHM, sizeof(__m256i)*segLen);
                (void)memcpy(pvHSMax, pvHS, sizeof(__m256i)*segLen);
                (void)memcpy(pvHLMax, pvHL, sizeof(__m256i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m256i vH = _mm256_load_si256(pvH + offset);
            __m256i vHM = _mm256_load_si256(pvHM + offset);
            __m256i vHS = _mm256_load_si256(pvHS + offset);
            __m256i vHL = _mm256_load_si256(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
                vHM = _mm256_slli_si256_rpl(vHM, 4);
                vHS = _mm256_slli_si256_rpl(vHS, 4);
                vHL = _mm256_slli_si256_rpl(vHL, 4);
            }
            result->stats->rowcols->score_row[j] = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
            result->stats->rowcols->matches_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHS, 7);
            result->stats->rowcols->length_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHL, 7);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int32_t *t = (int32_t*)pvHMax;
        int32_t *m = (int32_t*)pvHMMax;
        int32_t *s = (int32_t*)pvHSMax;
        int32_t *l = (int32_t*)pvHLMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                    matches = *m;
                    similar = *s;
                    length = *l;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}